

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.hpp
# Opt level: O1

pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
jessilib::ustring_to_mbstring<char16_t>
          (pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,jessilib *this,
          basic_string_view<char16_t,_std::char_traits<char16_t>_> in_string)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ushort uVar2;
  pointer pcVar3;
  bool bVar4;
  ulong __n;
  ushort *puVar5;
  uint uVar6;
  long lVar7;
  mbstate_t mbstate;
  char buffer [16];
  undefined8 local_50;
  char local_48 [24];
  
  puVar5 = (ushort *)in_string._M_len;
  __return_storage_ptr__->first = false;
  paVar1 = &(__return_storage_ptr__->second).field_2;
  (__return_storage_ptr__->second)._M_dataplus._M_p = (pointer)paVar1;
  (__return_storage_ptr__->second)._M_string_length = 0;
  (__return_storage_ptr__->second).field_2._M_local_buf[0] = '\0';
  bVar4 = false;
  local_50 = 0;
  while( true ) {
    if (this == (jessilib *)0x0) {
      uVar6 = 0;
      lVar7 = 0;
    }
    else {
      uVar2 = *puVar5;
      uVar6 = (uint)uVar2;
      lVar7 = 1;
      if (((this != (jessilib *)0x1) && ((uVar2 & 0xfc00) == 0xd800)) &&
         ((puVar5[1] & 0xfc00) == 0xdc00)) {
        uVar6 = (uint)uVar2 * 0x400 + (uint)puVar5[1] + 0xfca02400;
        lVar7 = 2;
      }
    }
    if (this == (jessilib *)0x0) break;
    __n = c32rtomb(local_48,uVar6,&local_50);
    if (__n < 0x11) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&__return_storage_ptr__->second,local_48,__n);
    }
    else {
      __return_storage_ptr__->first = false;
      bVar4 = true;
    }
    puVar5 = puVar5 + lVar7;
    this = this + -lVar7;
    if (0x10 < __n) {
      if ((!bVar4) &&
         (pcVar3 = (__return_storage_ptr__->second)._M_dataplus._M_p,
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)pcVar3 != paVar1)) {
        operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
      }
      return __return_storage_ptr__;
    }
  }
  __return_storage_ptr__->first = true;
  return __return_storage_ptr__;
}

Assistant:

std::pair<bool, std::string> ustring_to_mbstring(std::basic_string_view<CharT> in_string) {
	std::pair<bool, std::string> result;

	std::mbstate_t mbstate{};
	decode_result decode;
	while ((decode = decode_codepoint(in_string)).units != 0) {
		in_string.remove_prefix(decode.units);

		char buffer[MB_LEN_MAX]; // MB_LEN_MAX is constant, MB_CUR_MAX is not, and C++ doesn't have VLAs
		size_t bytes_written = std::c32rtomb(buffer, decode.codepoint, &mbstate);
		if (bytes_written > MB_LEN_MAX) {
			// Invalid codepoint; return
			result.first = false;
			return result;
		}

		result.second.append(buffer, bytes_written);
	}

	result.first = true;
	return result;
}